

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.cpp
# Opt level: O0

void __thiscall CampResource_ConvertFails_Test::TestBody(CampResource_ConvertFails_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Host2 *pHVar3;
  char *in_R9;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  bool local_b1;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_;
  Message local_98 [2];
  runtime_error *anon_var_0;
  type e;
  undefined1 auStack_58 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  Host local_21;
  undefined1 local_20 [8];
  Resource h1;
  CampResource_ConvertFails_Test *this_local;
  
  h1.m_value.
  super___shared_ptr<camp::resources::v1::Resource::ContextInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  camp::resources::v1::Host::Host(&local_21,-1);
  camp::resources::v1::Resource::Resource<camp::resources::v1::Host,void>
            ((Resource *)local_20,&local_21);
  camp::resources::v1::Resource::get<camp::resources::v1::Host>((Resource *)local_20);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_58[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffffa9 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_58);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_58);
  if (bVar1) {
    e._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      camp::resources::v1::Resource::get<Host2>((Resource *)local_20);
    }
    if ((e._7_1_ & 1) != 0) {
      e._0_4_ = 0;
      goto LAB_0010d8e6;
    }
    std::__cxx11::string::operator=
              ((string *)auStack_58,
               "Expected: h1.get<Host2>() throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_98);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/test/resource.cpp",0x1e,
             pcVar2);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_98);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
  testing::Message::~Message(local_98);
  e._0_4_ = 1;
LAB_0010d8e6:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_58);
  if ((uint)e == 0) {
    pHVar3 = camp::resources::v1::Resource::try_get<Host2>((Resource *)local_20);
    local_b1 = pHVar3 == (Host2 *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_b0,&local_b1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_b0,(AssertionResult *)"h1.try_get<Host2>()","true",
                 "false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]camp/test/resource.cpp",
                 0x1f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      testing::Message::~Message(&local_c0);
    }
    e._0_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    if ((uint)e == 0) {
      e._0_4_ = 0;
    }
  }
  camp::resources::v1::Resource::~Resource((Resource *)local_20);
  return;
}

Assistant:

TEST(CampResource, ConvertFails)
{
  Resource h1{Host()};
  h1.get<Host>();
  ASSERT_THROW(h1.get<Host2>(), std::runtime_error);
  ASSERT_FALSE(h1.try_get<Host2>());
}